

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

string * __thiscall
ghc::filesystem::path::string_abi_cxx11_(string *__return_storage_ptr__,path *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE std::string path::string() const
{
#ifdef GHC_USE_WCHAR_T
    return detail::toUtf8(native());
#else
    return native();
#endif
}